

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O0

Pass * wasm::createRedundantSetEliminationPass(void)

{
  RedundantSetElimination *this;
  
  this = (RedundantSetElimination *)operator_new(0x350);
  memset(this,0,0x350);
  anon_unknown_21::RedundantSetElimination::RedundantSetElimination(this);
  return (Pass *)this;
}

Assistant:

Pass* createRedundantSetEliminationPass() {
  return new RedundantSetElimination();
}